

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManInvertPos(Gia_Man_t *pAig)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  long lVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  ulong uVar6;
  
  pVVar4 = pAig->vCos;
  uVar6 = (ulong)(uint)pVVar4->nSize;
  if (pAig->nRegs < pVVar4->nSize) {
    lVar3 = 0;
    do {
      if ((int)uVar6 <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pVVar4->pArray[lVar3];
      if (((long)iVar2 < 0) || (pAig->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pAig->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar1 = pAig->pObjs + iVar2;
      uVar6 = *(ulong *)pGVar1;
      uVar5 = (uint)uVar6;
      if ((-1 < (int)uVar5) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x219,"void Gia_ObjFlipFaninC0(Gia_Obj_t *)");
      }
      *(ulong *)pGVar1 = uVar6 ^ 0x20000000;
      lVar3 = lVar3 + 1;
      pVVar4 = pAig->vCos;
      uVar6 = (ulong)pVVar4->nSize;
    } while (lVar3 < (long)(uVar6 - (long)pAig->nRegs));
  }
  return;
}

Assistant:

void Gia_ManInvertPos( Gia_Man_t * pAig )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachPo( pAig, pObj, i )
        Gia_ObjFlipFaninC0( pObj );
}